

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O2

void __thiscall
ot::commissioner::JoinerSession::RelaySocket::RelaySocket(RelaySocket *this,RelaySocket *aOther)

{
  pointer puVar1;
  
  Socket::Socket(&this->super_Socket,&aOther->super_Socket);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RelaySocket_00261a20;
  this->mJoinerSession = aOther->mJoinerSession;
  puVar1 = (aOther->mPeerAddr).mBytes.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start =
       (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = puVar1;
  (this->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mPeerPort = aOther->mPeerPort;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->mLocalAddr).mBytes,&(aOther->mLocalAddr).mBytes);
  this->mLocalPort = aOther->mLocalPort;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

JoinerSession::RelaySocket::RelaySocket(RelaySocket &&aOther)
    : Socket(std::move(static_cast<Socket &&>(aOther)))
    , mJoinerSession(aOther.mJoinerSession)
    , mPeerAddr(std::move(aOther.mPeerAddr))
    , mPeerPort(std::move(aOther.mPeerPort))
    , mLocalAddr(aOther.mLocalAddr)
    , mLocalPort(aOther.mLocalPort)
{
}